

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMeshControl::CreateInterfaceElements(TPZMHMeshControl *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  TPZGeoMesh *pTVar7;
  pointer ppVar8;
  TPZGeoEl **ppTVar9;
  TPZCompEl *pTVar10;
  TPZCompElSide *left;
  TPZGeoEl *pTVar11;
  int64_t iVar12;
  undefined4 extraout_var;
  long in_RDI;
  size_t in_stack_000000d8;
  char *in_stack_000000e0;
  TPZGeoEl *gelnew;
  int matid_1;
  TPZCompElSide csmall;
  TPZGeoElSide neighbour_1;
  TPZGeoElSide smallGeoElSide;
  TPZStack<TPZGeoElSide,_10> gelstack;
  int neighmatid;
  TPZGeoElSide neighbour;
  TPZCompElSide celskeleton;
  TPZGeoElSide gelside;
  TPZGeoEl *gel;
  int numlado;
  int matidright;
  int matidleft;
  int matid;
  int64_t rightelindex;
  int64_t leftelindex;
  int64_t elindex;
  iterator it;
  int dim;
  TPZGeoElSide *in_stack_fffffffffffffcb8;
  TPZCompMesh *in_stack_fffffffffffffcc0;
  TPZGeoEl *in_stack_fffffffffffffcc8;
  TPZCompMesh *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  uint in_stack_fffffffffffffcdc;
  TPZChunkVector<TPZGeoEl_*,_10> *in_stack_fffffffffffffce0;
  TPZGeoEl *geo;
  int in_stack_fffffffffffffd4c;
  TPZInterfaceElement *in_stack_fffffffffffffd50;
  uint local_254;
  TPZCompElSide local_250;
  TPZCompEl *in_stack_fffffffffffffdc0;
  TPZMHMeshControl *in_stack_fffffffffffffdc8;
  TPZGeoElSide local_228;
  undefined4 local_20c;
  TPZGeoElSide local_208;
  undefined1 local_1f0 [324];
  int local_ac;
  TPZGeoElSide local_a8;
  TPZCompElSide local_80;
  TPZGeoElSide local_70;
  TPZGeoEl *local_58;
  undefined4 local_50;
  uint local_4c;
  uint local_48;
  undefined4 local_44;
  long local_40;
  long local_38;
  long local_30;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> local_18;
  int local_c;
  
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x10));
  TPZCompMesh::LoadReferences(in_stack_fffffffffffffcd0);
  pTVar7 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
  local_c = TPZGeoMesh::Dimension(pTVar7);
  std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::_Rb_tree_iterator
            (&local_18);
  local_20 = (_Base_ptr)
             std::
             map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
             ::begin((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                      *)in_stack_fffffffffffffcb8);
  local_18._M_node = local_20;
  do {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
         ::end((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
                *)in_stack_fffffffffffffcb8);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) {
      return;
    }
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1e0bb70);
    local_30 = ppVar8->first;
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1e0bb88);
    local_38 = (ppVar8->second).first;
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
                        0x1e0bba1);
    local_40 = (ppVar8->second).second;
    local_44 = 0;
    if ((local_38 < local_40) || (local_40 == local_30)) {
      local_48 = *(uint *)(in_RDI + 0x44);
      local_4c = *(uint *)(in_RDI + 0x48);
    }
    else {
      local_48 = *(uint *)(in_RDI + 0x48);
      local_4c = *(uint *)(in_RDI + 0x44);
    }
    local_50 = 2;
    if (local_40 == local_30) {
      local_50 = 1;
    }
    pTVar7 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
    TPZGeoMesh::ElementVec(pTVar7);
    ppTVar9 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (in_stack_fffffffffffffce0,
                         CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    local_58 = *ppTVar9;
    (**(code **)(*(long *)local_58 + 0xf0))();
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
               (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
    TPZGeoElSide::Reference((TPZGeoElSide *)in_stack_fffffffffffffcc8);
    pTVar10 = TPZCompElSide::Element(&local_80);
    if (pTVar10 == (TPZCompEl *)0x0) {
      pzinternal::DebugStopImpl(in_stack_000000e0,in_stack_000000d8);
    }
    TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffcc8);
    while (iVar2 = TPZGeoElSide::operator!=(&local_a8,&local_70), iVar2 != 0) {
      in_stack_fffffffffffffd50 = (TPZInterfaceElement *)TPZGeoElSide::Element(&local_a8);
      in_stack_fffffffffffffd4c = TPZGeoEl::MaterialId((TPZGeoEl *)in_stack_fffffffffffffd50);
      local_ac = in_stack_fffffffffffffd4c;
      if ((in_stack_fffffffffffffd4c == *(int *)(in_RDI + 0xbc)) ||
         (in_stack_fffffffffffffd4c == *(int *)(in_RDI + 0xc0))) break;
      TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffcc8);
      TPZGeoElSide::operator=((TPZGeoElSide *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e0be33);
    }
    iVar2 = TPZGeoElSide::operator==(&local_a8,&local_70);
    if (iVar2 != 0) {
      pzinternal::DebugStopImpl(in_stack_000000e0,in_stack_000000d8);
    }
    TPZStack<TPZGeoElSide,_10>::TPZStack((TPZStack<TPZGeoElSide,_10> *)in_stack_fffffffffffffcd0);
    geo = (TPZGeoEl *)local_1f0;
    TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    TPZStack<TPZGeoElSide,_10>::Push
              ((TPZStack<TPZGeoElSide,_10> *)in_stack_fffffffffffffcd0,
               (TPZGeoElSide *)in_stack_fffffffffffffcc8);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e0bec7);
    while (left = (TPZCompElSide *)
                  TPZVec<TPZGeoElSide>::size((TPZVec<TPZGeoElSide> *)(local_1f0 + 0x18)),
          left != (TPZCompElSide *)0x0) {
      TPZStack<TPZGeoElSide,_10>::Pop
                ((TPZStack<TPZGeoElSide,_10> *)
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      iVar3 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffffcc0);
      iVar4 = (**(code **)(*(long *)local_58 + 0x210))();
      if (iVar3 == iVar4) {
        TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffcc8);
        while (iVar5 = TPZGeoElSide::operator!=(&local_228,&local_208), iVar5 != 0) {
          pTVar11 = TPZGeoElSide::Element(&local_228);
          iVar5 = (**(code **)(*(long *)pTVar11 + 0x210))();
          pTVar7 = TPZAutoPointer<TPZGeoMesh>::operator->
                             ((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 8));
          iVar6 = TPZGeoMesh::Dimension(pTVar7);
          if (iVar5 == iVar6) {
            TPZGeoElSide::Reference((TPZGeoElSide *)in_stack_fffffffffffffcc8);
            bVar1 = TPZCompElSide::operator_cast_to_bool(&local_250);
            if (bVar1) {
              local_254 = 0xffffffff;
              TPZCompElSide::Element(&local_250);
              iVar12 = WhichSubdomain(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
              if (iVar12 == local_38) {
                local_254 = local_48;
              }
              else {
                TPZCompElSide::Element(&local_250);
                iVar12 = WhichSubdomain(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
                if (iVar12 == local_40) {
                  local_254 = local_4c;
                }
              }
              if (local_254 == 0xffffffff) {
                pzinternal::DebugStopImpl(in_stack_000000e0,in_stack_000000d8);
              }
              in_stack_fffffffffffffce0 =
                   (TPZChunkVector<TPZGeoEl_*,_10> *)TPZGeoElSide::Element(&local_208);
              in_stack_fffffffffffffcdc = TPZGeoElSide::Side(&local_208);
              iVar5 = (*(in_stack_fffffffffffffce0->super_TPZSavable)._vptr_TPZSavable[0x2e])
                                (in_stack_fffffffffffffce0,(ulong)in_stack_fffffffffffffcdc,
                                 (ulong)local_254);
              in_stack_fffffffffffffcd0 = (TPZCompMesh *)CONCAT44(extraout_var,iVar5);
              in_stack_fffffffffffffcc8 = (TPZGeoEl *)operator_new(0x80);
              in_stack_fffffffffffffcc0 =
                   ::TPZAutoPointer::operator_cast_to_TPZCompMesh_
                             ((TPZAutoPointer *)(in_RDI + 0x10));
              TPZInterfaceElement::TPZInterfaceElement
                        (in_stack_fffffffffffffd50,
                         (TPZCompMesh *)CONCAT44(in_stack_fffffffffffffd4c,iVar2),geo,left,
                         (TPZCompElSide *)CONCAT44(iVar3,iVar4));
            }
            TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffcc8);
            TPZGeoElSide::operator=
                      ((TPZGeoElSide *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e0c2a4);
          }
          else {
            TPZGeoElSide::Neighbour((TPZGeoElSide *)in_stack_fffffffffffffcc8);
            TPZGeoElSide::operator=
                      ((TPZGeoElSide *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e0c081);
          }
        }
        TPZGeoElSide::GetSubElements2
                  ((TPZGeoElSide *)in_stack_fffffffffffffcc0,
                   (TPZStack<TPZGeoElSide,_10> *)in_stack_fffffffffffffcb8);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e0c2cd);
        local_20c = 0;
      }
      else {
        local_20c = 7;
      }
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e0c2e5);
    }
    TPZStack<TPZGeoElSide,_10>::~TPZStack((TPZStack<TPZGeoElSide,_10> *)0x1e0c325);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e0c332);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e0c33f);
    std::_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_long,_std::pair<long,_long>_>_> *)
               in_stack_fffffffffffffcc8,(int)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
  } while( true );
}

Assistant:

void TPZMHMeshControl::CreateInterfaceElements()
{
    fCMesh->LoadReferences();
    int dim = fGMesh->Dimension();
    std::map<int64_t, std::pair<int64_t,int64_t> >::iterator it;
    /// loop over the skeleton elements
    for (it=fInterfaces.begin(); it != fInterfaces.end(); it++) {
        // index of the skeleton element
        int64_t elindex = it->first;
        // left and right indexes in the coarse mesh
        int64_t leftelindex = it->second.first;
        int64_t rightelindex = it->second.second;
        // skip boundary elements
        int matid = 0, matidleft = 0, matidright = 0;

        // second condition indicates a boundary element
        if (leftelindex < rightelindex || rightelindex == elindex)
        {
            matidleft = fLagrangeMatIdLeft;
            matidright = fLagrangeMatIdRight;
        }
        else
        {
            matidleft = fLagrangeMatIdRight;
            matidright = fLagrangeMatIdLeft;
        }
        int numlado = 2;
        if (rightelindex == elindex) {
            numlado = 1;
        }

        TPZGeoEl *gel = fGMesh->ElementVec()[elindex];
        TPZGeoElSide gelside(gel,gel->NSides()-1);
        TPZCompElSide celskeleton = gelside.Reference();
        // the skeleton element must exist
        if(!celskeleton.Element()) DebugStop();
        TPZGeoElSide neighbour = gelside.Neighbour();
        while(neighbour != gelside)
        {
            int neighmatid = neighbour.Element()->MaterialId();
            if(neighmatid == fSkeletonWrapMatId || neighmatid == fBoundaryWrapMatId)
            {
                break;
            }
            neighbour = neighbour.Neighbour();
        }
        if (neighbour == gelside) {
            DebugStop();
        }
        TPZStack<TPZGeoElSide> gelstack;
        gelstack.Push(neighbour);
        while (gelstack.size())
        {
            TPZGeoElSide smallGeoElSide = gelstack.Pop();
            // the smaller elements returned by GetSubElements include element/sides of lower dimension
            if (smallGeoElSide.Dimension() != gel->Dimension()) {
                continue;
            }
            // look for the neighbours of smallGeoElSide for elements which are of dimension of the fGMesh
            // and which beint64_t to the subdomains
            TPZGeoElSide neighbour = smallGeoElSide.Neighbour();
            while (neighbour != smallGeoElSide)
            {
                if (neighbour.Element()->Dimension() != fGMesh->Dimension()) {
                    neighbour = neighbour.Neighbour();
                    continue;
                }
                TPZCompElSide csmall = neighbour.Reference();
                if (csmall)
                {
                    int matid = -1;
                    if(WhichSubdomain(csmall.Element()) == leftelindex) {
                        matid = matidleft;
                    }
                    else if(WhichSubdomain(csmall.Element()) == rightelindex)
                    {
                        matid = matidright;
                    }
                    if (matid == -1) {
                        DebugStop();
                    }
                    // create an interface between the finer element and the MHM flux
                    TPZGeoEl *gelnew = smallGeoElSide.Element()->CreateBCGeoEl(smallGeoElSide.Side(), matid);
                    new TPZInterfaceElement(fCMesh, gelnew, csmall, celskeleton);
#ifdef PZ_LOG
                    if (logger.isDebugEnabled()) {
                        std::stringstream sout;
                        sout << "New interface left " << smallGeoElSide.Element()->Index() << " right " << gel->Index() << " matid " << matid;
                        sout << " interface index " << gelnew->Reference()->Index() << " beint64_ts to subdomain " << WhichSubdomain(gelnew->Reference());
                        LOGPZ_DEBUG(logger, sout.str())
                    }
#endif
                }
                neighbour = neighbour.Neighbour();
            }

            smallGeoElSide.GetSubElements2(gelstack);
        }
    }
}